

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  rep rVar4;
  undefined8 *in_RSI;
  int in_EDI;
  thread streamer;
  StreamClient stream;
  milliseconds cycleTime;
  StreamMetaCb_t *in_stack_fffffffffffbfd68;
  StreamClient *in_stack_fffffffffffbfd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  *this;
  offset_in_StreamClient_to_subr *in_stack_fffffffffffbfd88;
  _Bind<int_(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffbfd98;
  undefined6 in_stack_fffffffffffbfda0;
  undefined1 in_stack_fffffffffffbfda7;
  StreamClient *in_stack_fffffffffffbfdb0;
  bool bStack_40241;
  function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  fStack_401c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_401a0 [8202];
  int local_5c;
  rep local_58;
  allocator local_4e;
  byte local_4d;
  byte local_3a;
  undefined1 local_39 [33];
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  undefined8 *local_10;
  int local_8;
  uchar local_4 [4];
  
  local_4[0] = '\0';
  local_4[1] = '\0';
  local_4[2] = '\0';
  local_4[3] = '\0';
  local_18.__r = 3000;
  local_3a = 0;
  local_4d = 0;
  bStack_40241 = true;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (1 < in_EDI) {
    pcVar1 = (char *)in_RSI[1];
    in_stack_fffffffffffbfdb0 = (StreamClient *)local_39;
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string
              ((string *)(local_39 + 1),pcVar1,(allocator *)in_stack_fffffffffffbfdb0);
    local_4d = 1;
    in_stack_fffffffffffbfda7 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffbfd70,(char *)in_stack_fffffffffffbfd68);
    bStack_40241 = (bool)in_stack_fffffffffffbfda7;
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_39 + 1));
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_39);
  }
  if ((bStack_40241 & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "periodically connects to a daq stream, subscribes all signals and disconnects after a specified time"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"syntax: ");
    poVar3 = std::operator<<(poVar3,(char *)*local_10);
    poVar3 = std::operator<<(poVar3," <stream server address> <cycle time in ms (default is ");
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_18);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
    poVar3 = std::operator<<(poVar3,")>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  if ((main::address_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&main::address_abi_cxx11_), iVar2 != 0)) {
    in_stack_fffffffffffbfd88 = (offset_in_StreamClient_to_subr *)local_10[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&main::address_abi_cxx11_,(char *)in_stack_fffffffffffbfd88,&local_4e);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e);
    __cxa_atexit(std::__cxx11::string::~string,&main::address_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&main::address_abi_cxx11_);
  }
  if (2 < local_8) {
    local_5c = atoi((char *)local_10[2]);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_58,&local_5c);
    local_18.__r = local_58;
  }
  __args_1 = abStack_401a0;
  hbm::streaming::StreamClient::StreamClient(in_stack_fffffffffffbfdb0);
  this = &fStack_401c0;
  std::function<void(hbm::streaming::StreamClient&,std::__cxx11::string_const&,Json::Value_const&)>
  ::
  function<void(&)(hbm::streaming::StreamClient&,std::__cxx11::string_const&,Json::Value_const&),void>
            (this,(_func_void_StreamClient_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_Value_ptr
                   *)__args_1);
  hbm::streaming::StreamClient::setStreamMetaCb(in_stack_fffffffffffbfd70,in_stack_fffffffffffbfd68)
  ;
  std::
  function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  ::~function((function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
               *)0x13802c);
  do {
    std::
    bind<int(hbm::streaming::StreamClient::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&),hbm::streaming::StreamClient*,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[1]>
              (in_stack_fffffffffffbfd88,(StreamClient **)this,__args_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffbfd70,(char (*) [1])in_stack_fffffffffffbfd68);
    std::thread::
    thread<std::_Bind<int(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient*,std::__cxx11::string,std::__cxx11::string,char_const*))(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>,,void>
              ((thread *)
               CONCAT17(in_stack_fffffffffffbfda7,CONCAT16(bStack_40241,in_stack_fffffffffffbfda0)),
               in_stack_fffffffffffbfd98);
    std::
    _Bind<int_(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~_Bind((_Bind<int_(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)0x138097);
    in_stack_fffffffffffbfd70 = (StreamClient *)std::operator<<((ostream *)&std::cout,"Started");
    std::ostream::operator<<(in_stack_fffffffffffbfd70,std::endl<char,std::char_traits<char>>);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT17(in_stack_fffffffffffbfda7,CONCAT16(bStack_40241,in_stack_fffffffffffbfda0)))
    ;
    hbm::streaming::StreamClient::stop(in_stack_fffffffffffbfd70);
    std::thread::join();
    std::thread::~thread((thread *)0x1380fe);
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	std::chrono::milliseconds cycleTime(3000);

	if((argc<2) || (std::string(argv[1])=="-h") ) {
		std::cout << "periodically connects to a daq stream, subscribes all signals and disconnects after a specified time" << std::endl;
		std::cout << "syntax: " << argv[0] << " <stream server address> <cycle time in ms (default is " << cycleTime.count() << ")>" << std::endl;
		return EXIT_SUCCESS;
	}


	static const std::string address = argv[1];



	if(argc>2) {
		cycleTime = std::chrono::milliseconds(atoi(argv[2]));
	}

	hbm::streaming::StreamClient stream;
	stream.setStreamMetaCb(streamMetaInformationCb);
	do {
		std::thread streamer = std::thread(std::bind(&hbm::streaming::StreamClient::start, &stream, address, hbm::streaming::DAQSTREAM_PORT, ""));
		std::cout << "Started" << std::endl;
		std::this_thread::sleep_for(cycleTime);
		stream.stop();
		streamer.join();
	} while(true);
}